

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u16 computeNumericType(Mem *pMem)

{
  int iVar1;
  undefined1 *puVar2;
  u16 uVar3;
  long in_FS_OFFSET;
  sqlite3_int64 ix;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  if (((pMem->flags & 0x400) == 0) || (iVar1 = sqlite3VdbeMemExpandBlob(pMem), iVar1 == 0)) {
    iVar1 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
    uVar3 = 8;
    if (iVar1 < 1) {
      if ((iVar1 != 0) ||
         (iVar1 = sqlite3Atoi64(pMem->z,(i64 *)&local_20,pMem->n,pMem->enc), puVar2 = local_20,
         1 < iVar1)) goto LAB_001548c9;
    }
    else if ((iVar1 != 1) ||
            (iVar1 = sqlite3Atoi64(pMem->z,(i64 *)&local_20,pMem->n,pMem->enc), puVar2 = local_20,
            iVar1 != 0)) goto LAB_001548c9;
  }
  else {
    puVar2 = (undefined1 *)0x0;
  }
  (pMem->u).r = (double)puVar2;
  uVar3 = 4;
LAB_001548c9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

static u16 SQLITE_NOINLINE computeNumericType(Mem *pMem){
  int rc;
  sqlite3_int64 ix;
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal))==0 );
  assert( (pMem->flags & (MEM_Str|MEM_Blob))!=0 );
  if( ExpandBlob(pMem) ){
    pMem->u.i = 0;
    return MEM_Int;
  }
  rc = sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
  if( rc<=0 ){
    if( rc==0 && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)<=1 ){
      pMem->u.i = ix;
      return MEM_Int;
    }else{
      return MEM_Real;
    }
  }else if( rc==1 && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)==0 ){
    pMem->u.i = ix;
    return MEM_Int;
  }
  return MEM_Real;
}